

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

bool __thiscall
QOpenGLProgramBinaryCache::load(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry> *this_00;
  uint blobFormat;
  uint blobSize;
  FdWrapper __fd;
  bool bVar1;
  MemCacheEntry *pMVar2;
  ssize_t sVar3;
  int *piVar4;
  QDebug *pQVar5;
  char *p;
  QOpenGLProgramBinaryCache *pQVar6;
  undefined1 *p_00;
  long in_FS_OFFSET;
  QDebug local_1b0;
  undefined1 local_1a8 [96];
  QArrayDataPointer<char> local_148;
  GLEnvInfo info;
  R local_d8;
  Chain *local_c8;
  FdWrapper fdw;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char> local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &this->m_mutex;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_58._0_8_);
  local_58[8] = true;
  this_00 = &this->m_memCache;
  pQVar6 = (QOpenGLProgramBinaryCache *)this_00;
  pMVar2 = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::relink(this_00,cacheKey);
  if (pMVar2 != (MemCacheEntry *)0x0) {
    p = (pMVar2->blob).d.ptr;
    if (p == (char *)0x0) {
      p = (char *)&QByteArray::_empty;
    }
    bVar1 = setProgramBinary(pQVar6,programId,pMVar2->format,p,(uint)(pMVar2->blob).d.size);
    goto LAB_004d9ae7;
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_98.size = 0;
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  cacheFileName((QString *)&local_b8,this,cacheKey);
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  DeferredFileRemove::DeferredFileRemove((DeferredFileRemove *)local_78,(QString *)&local_b8);
  fdw.fd = -0x55555556;
  FdWrapper::FdWrapper(&fdw,(QString *)&local_b8);
  __fd = fdw;
  if (fdw.fd == -1) {
LAB_004d9866:
    bVar1 = false;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    do {
      pQVar6 = (QOpenGLProgramBinaryCache *)(ulong)(uint)__fd.fd;
      sVar3 = ::read(__fd.fd,&local_48,0x10);
      if (sVar3 != -1) {
        if (sVar3 == 0x10) {
          pQVar6 = (QOpenGLProgramBinaryCache *)&info;
          QByteArray::fromRawData((QByteArray *)pQVar6,(char *)&local_48,0x10);
          local_98.ptr = info.glvendor.d.ptr;
          local_98.d = info.glvendor.d.d;
          info.glvendor.d.d = (Data *)0x0;
          info.glvendor.d.ptr = (char *)0x0;
          local_98.size = info.glvendor.d.size;
          info.glvendor.d.size = 0;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)pQVar6);
        }
        break;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    bVar1 = verifyHeader(pQVar6,(QByteArray *)&local_98);
    if (!bVar1) {
      local_78[0x18] = 1;
      goto LAB_004d9866;
    }
    local_d8.mapSize = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    FdWrapper::map((FdWrapper *)&local_d8);
    if ((Chain *)local_d8.ptr == (Chain *)0xffffffffffffffff) {
      local_78[0x18] = 1;
      bVar1 = false;
    }
    else {
      local_c8 = (Chain *)((long)local_d8.ptr + 0x10);
      info.glversion.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      info.glversion.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      info.glversion.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      info.glrenderer.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      info.glrenderer.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      info.glvendor.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      info.glrenderer.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      info.glvendor.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      info.glvendor.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_19b94e7::GLEnvInfo::GLEnvInfo(&info);
      local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.ptr = &DAT_aaaaaaaaaaaaaaaa;
      readStr((QByteArray *)&local_148,(uchar **)&local_c8);
      bVar1 = ::operator!=((QByteArray *)&local_148,&info.glvendor);
      if (bVar1) {
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          local_1a8._64_4_ = 2;
          local_1a8._68_8_ = 0;
          local_1a8._76_8_ = 0;
          local_1a8._84_4_ = 0;
          local_1a8._88_8_ = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          QMessageLogger::debug();
          pQVar5 = QDebug::operator<<((QDebug *)(local_1a8 + 0x20),"GL_VENDOR does not match");
          pQVar5 = QDebug::operator<<(pQVar5,(QByteArray *)&local_148);
          QDebug::operator<<(pQVar5,&info.glvendor);
          QDebug::~QDebug((QDebug *)(local_1a8 + 0x20));
        }
        local_78[0x18] = 1;
        bVar1 = false;
      }
      else {
        local_1a8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        readStr((QByteArray *)(local_1a8 + 0x20),(uchar **)&local_c8);
        bVar1 = ::operator!=((QByteArray *)(local_1a8 + 0x20),&info.glrenderer);
        if (bVar1) {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_1a8._64_4_ = 2;
            local_1a8._68_8_ = 0;
            local_1a8._76_8_ = 0;
            local_1a8._84_4_ = 0;
            local_1a8._88_8_ = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QMessageLogger::debug();
            pQVar5 = QDebug::operator<<((QDebug *)local_1a8,"GL_RENDERER does not match");
            pQVar5 = QDebug::operator<<(pQVar5,(QByteArray *)(local_1a8 + 0x20));
            QDebug::operator<<(pQVar5,&info.glrenderer);
            QDebug::~QDebug((QDebug *)local_1a8);
          }
          local_78[0x18] = 1;
          bVar1 = false;
        }
        else {
          pQVar6 = (QOpenGLProgramBinaryCache *)local_1a8;
          local_1a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          readStr((QByteArray *)pQVar6,(uchar **)&local_c8);
          bVar1 = ::operator!=((QByteArray *)pQVar6,&info.glversion);
          if (bVar1) {
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.
                       enabledDebug._q_value._M_base._M_i & 1) != 0) {
              local_1a8._64_4_ = 2;
              local_1a8._68_8_ = 0;
              local_1a8._76_8_ = 0;
              local_1a8._84_4_ = 0;
              local_1a8._88_8_ = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
              QMessageLogger::debug();
              pQVar5 = QDebug::operator<<(&local_1b0,"GL_VERSION does not match");
              pQVar5 = QDebug::operator<<(pQVar5,(QByteArray *)local_1a8);
              QDebug::operator<<(pQVar5,&info.glversion);
              QDebug::~QDebug(&local_1b0);
            }
            local_78[0x18] = 1;
LAB_004d9a79:
            bVar1 = false;
          }
          else {
            blobFormat = *(uint *)&local_c8->prev;
            blobSize = *(uint *)((long)&local_c8->prev + 4);
            p_00 = (undefined1 *)
                   ((long)local_c8 +
                   (((ulong)((undefined1 *)(local_1a8._16_8_ + local_148.size) + 7 +
                            (long)&(((Data *)(local_1a8._48_8_ + 0x20))->super_QArrayData).ref_) &
                    0x7ffffffffffffffc) -
                   (long)((undefined1 *)(local_1a8._16_8_ + local_148.size) +
                         (long)&((QArrayData *)local_1a8._48_8_)->ref_)) + -0x1c);
            bVar1 = setProgramBinary(pQVar6,programId,blobFormat,p_00,blobSize);
            if (!bVar1) goto LAB_004d9a79;
            pMVar2 = (MemCacheEntry *)operator_new(0x20);
            MemCacheEntry::MemCacheEntry(pMVar2,p_00,blobSize,blobFormat);
            bVar1 = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::insert
                              (this_00,cacheKey,pMVar2,1);
          }
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_1a8);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_1a8 + 0x20));
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_148);
      anon_unknown.dwarf_19b94e7::GLEnvInfo::~GLEnvInfo(&info);
    }
    FdWrapper::map::R::~R(&local_d8);
  }
  FdWrapper::~FdWrapper(&fdw);
  DeferredFileRemove::~DeferredFileRemove((DeferredFileRemove *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
LAB_004d9ae7:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QOpenGLProgramBinaryCache::load(const QByteArray &cacheKey, uint programId)
{
    QMutexLocker lock(&m_mutex);
    if (const MemCacheEntry *e = m_memCache.object(cacheKey))
        return setProgramBinary(programId, e->format, e->blob.constData(), e->blob.size());

    QByteArray buf;
    const QString fn = cacheFileName(cacheKey);
    DeferredFileRemove undertaker(fn);
#ifdef Q_OS_UNIX
    FdWrapper fdw(fn);
    if (fdw.fd == -1)
        return false;
    char header[BASE_HEADER_SIZE];
    qint64 bytesRead = qt_safe_read(fdw.fd, header, BASE_HEADER_SIZE);
    if (bytesRead == BASE_HEADER_SIZE)
        buf = QByteArray::fromRawData(header, BASE_HEADER_SIZE);
#else
    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly))
        return false;
    buf = f.read(BASE_HEADER_SIZE);
#endif

    if (!verifyHeader(buf)) {
        undertaker.setActive();
        return false;
    }

    const uchar *p;
#ifdef Q_OS_UNIX
    const auto map = fdw.map();
    if (!map) {
        undertaker.setActive();
        return false;
    }
    p = static_cast<const uchar *>(map.ptr) + BASE_HEADER_SIZE;
#else
    buf = f.readAll();
    p = reinterpret_cast<const uchar *>(buf.constData());
#endif

    GLEnvInfo info;

    QByteArray vendor = readStr(&p);
    if (vendor != info.glvendor) {
        // readStr returns non-null terminated strings just pointing to inside
        // 'p' so must print these via the stream qCDebug and not constData().
        qCDebug(lcOpenGLProgramDiskCache) << "GL_VENDOR does not match" << vendor << info.glvendor;
        undertaker.setActive();
        return false;
    }
    QByteArray renderer = readStr(&p);
    if (renderer != info.glrenderer) {
        qCDebug(lcOpenGLProgramDiskCache) << "GL_RENDERER does not match" << renderer << info.glrenderer;
        undertaker.setActive();
        return false;
    }
    QByteArray version = readStr(&p);
    if (version != info.glversion) {
        qCDebug(lcOpenGLProgramDiskCache) <<  "GL_VERSION does not match" << version << info.glversion;
        undertaker.setActive();
        return false;
    }

    quint32 blobFormat = readUInt(&p);
    quint32 blobSize = readUInt(&p);

    p += PADDING_SIZE(FULL_HEADER_SIZE(vendor.size() + renderer.size() + version.size()));

    return setProgramBinary(programId, blobFormat, p, blobSize)
        && m_memCache.insert(cacheKey, new MemCacheEntry(p, blobSize, blobFormat));
}